

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDefaultSoftBodySolver.cpp
# Opt level: O0

void __thiscall
btDefaultSoftBodySolver::copySoftBodyToVertexBuffer
          (btDefaultSoftBodySolver *this,btSoftBody *softBody,btVertexBufferDescriptor *vertexBuffer
          )

{
  int iVar1;
  ulong uVar2;
  Node *pNVar3;
  btScalar *pbVar4;
  long *in_RDX;
  long in_RSI;
  btVector3 normal;
  int vertexIndex_1;
  float *normalPointer;
  int normalStride;
  int normalOffset;
  btVector3 position;
  int vertexIndex;
  float *vertexPointer;
  int vertexStride;
  int vertexOffset;
  float *basePointer;
  btCPUVertexBufferDescriptor *cpuVertexBuffer;
  int numVertices;
  btAlignedObjectArray<btSoftBody::Node> *clothVertices;
  btVector3 local_84;
  int local_74;
  btScalar *local_70;
  int local_64;
  int local_60;
  btVector3 local_5c;
  int local_4c;
  btScalar *local_48;
  int local_40;
  int local_3c;
  long local_38;
  long *local_30;
  int local_24;
  btAlignedObjectArray<btSoftBody::Node> *local_20;
  long *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = (**(code **)(*in_RDX + 0x20))();
  if (iVar1 == 0) {
    local_20 = (btAlignedObjectArray<btSoftBody::Node> *)(local_10 + 0x370);
    local_24 = btAlignedObjectArray<btSoftBody::Node>::size(local_20);
    local_30 = local_18;
    local_38 = (**(code **)(*local_18 + 0x48))();
    uVar2 = (**(code **)(*local_18 + 0x10))();
    if ((uVar2 & 1) != 0) {
      local_3c = (**(code **)(*local_30 + 0x28))();
      local_40 = (**(code **)(*local_30 + 0x30))();
      local_48 = (btScalar *)(local_38 + (long)local_3c * 4);
      for (local_4c = 0; local_4c < local_24; local_4c = local_4c + 1) {
        pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[](local_20,local_4c);
        local_5c.m_floats._0_8_ = *(undefined8 *)(pNVar3->m_x).m_floats;
        local_5c.m_floats._8_8_ = *(undefined8 *)((pNVar3->m_x).m_floats + 2);
        pbVar4 = btVector3::getX(&local_5c);
        *local_48 = *pbVar4;
        pbVar4 = btVector3::getY(&local_5c);
        local_48[1] = *pbVar4;
        pbVar4 = btVector3::getZ(&local_5c);
        local_48[2] = *pbVar4;
        local_48 = local_48 + local_40;
      }
    }
    uVar2 = (**(code **)(*local_18 + 0x18))();
    if ((uVar2 & 1) != 0) {
      local_60 = (**(code **)(*local_30 + 0x38))();
      local_64 = (**(code **)(*local_30 + 0x40))();
      local_70 = (btScalar *)(local_38 + (long)local_60 * 4);
      for (local_74 = 0; local_74 < local_24; local_74 = local_74 + 1) {
        pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[](local_20,local_74);
        local_84.m_floats._0_8_ = *(undefined8 *)(pNVar3->m_n).m_floats;
        local_84.m_floats._8_8_ = *(undefined8 *)((pNVar3->m_n).m_floats + 2);
        pbVar4 = btVector3::getX(&local_84);
        *local_70 = *pbVar4;
        pbVar4 = btVector3::getY(&local_84);
        local_70[1] = *pbVar4;
        pbVar4 = btVector3::getZ(&local_84);
        local_70[2] = *pbVar4;
        local_70 = local_70 + local_64;
      }
    }
  }
  return;
}

Assistant:

void btDefaultSoftBodySolver::copySoftBodyToVertexBuffer( const btSoftBody *const softBody, btVertexBufferDescriptor *vertexBuffer )
{
	// Currently only support CPU output buffers
	// TODO: check for DX11 buffers. Take all offsets into the same DX11 buffer
	// and use them together on a single kernel call if possible by setting up a
	// per-cloth target buffer array for the copy kernel.

	if( vertexBuffer->getBufferType() == btVertexBufferDescriptor::CPU_BUFFER )
	{
		const btAlignedObjectArray<btSoftBody::Node> &clothVertices( softBody->m_nodes );
		int numVertices = clothVertices.size();

		const btCPUVertexBufferDescriptor *cpuVertexBuffer = static_cast< btCPUVertexBufferDescriptor* >(vertexBuffer);						
		float *basePointer = cpuVertexBuffer->getBasePointer();						

		if( vertexBuffer->hasVertexPositions() )
		{
			const int vertexOffset = cpuVertexBuffer->getVertexOffset();
			const int vertexStride = cpuVertexBuffer->getVertexStride();
			float *vertexPointer = basePointer + vertexOffset;

			for( int vertexIndex = 0; vertexIndex < numVertices; ++vertexIndex )
			{
				btVector3 position = clothVertices[vertexIndex].m_x;
				*(vertexPointer + 0) = position.getX();
				*(vertexPointer + 1) = position.getY();
				*(vertexPointer + 2) = position.getZ();
				vertexPointer += vertexStride;
			}
		}
		if( vertexBuffer->hasNormals() )
		{
			const int normalOffset = cpuVertexBuffer->getNormalOffset();
			const int normalStride = cpuVertexBuffer->getNormalStride();
			float *normalPointer = basePointer + normalOffset;

			for( int vertexIndex = 0; vertexIndex < numVertices; ++vertexIndex )
			{
				btVector3 normal = clothVertices[vertexIndex].m_n;
				*(normalPointer + 0) = normal.getX();
				*(normalPointer + 1) = normal.getY();
				*(normalPointer + 2) = normal.getZ();
				normalPointer += normalStride;
			}
		}
	}
}